

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  bool bVar1;
  ImGuiID IVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *this;
  ImVec2 cr_min;
  ImVec2 cr_max;
  undefined4 uVar5;
  undefined4 uVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *pIVar8;
  int iVar9;
  ImU32 col;
  float fVar10;
  float fVar11;
  ImVec2 local_58;
  ImVec2 IStack_50;
  ImVec4 local_48;
  
  pIVar7 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if (GImGui->DragDropActive == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x24c0,"AcceptDragDropPayload","ImGui ASSERT FAILED: %s","g.DragDropActive");
  }
  if ((pIVar7->DragDropPayload).DataFrameCount == -1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x24c1,"AcceptDragDropPayload","ImGui ASSERT FAILED: %s",
                "payload.DataFrameCount != -1");
  }
  if ((type == (char *)0x0) ||
     (((pIVar7->DragDropPayload).DataFrameCount != -1 &&
      (iVar9 = strcmp(type,(pIVar7->DragDropPayload).DataType), iVar9 == 0)))) {
    IVar2 = pIVar7->DragDropTargetId;
    IVar3 = pIVar7->DragDropAcceptIdPrev;
    local_58 = (pIVar7->DragDropTargetRect).Min;
    IStack_50 = (pIVar7->DragDropTargetRect).Max;
    fVar10 = (IStack_50.y - local_58.y) * (IStack_50.x - local_58.x);
    if (fVar10 < pIVar7->DragDropAcceptIdCurrRectSurface) {
      pIVar7->DragDropAcceptFlags = flags;
      pIVar7->DragDropAcceptIdCurr = IVar2;
      pIVar7->DragDropAcceptIdCurrRectSurface = fVar10;
    }
    (pIVar7->DragDropPayload).Preview = IVar3 == IVar2;
    if (((pIVar7->DragDropSourceFlags | flags) & 0x800U) == 0 && IVar3 == IVar2) {
      fVar10 = local_58.x + -3.5;
      local_58.y = local_58.y + -3.5;
      fVar11 = IStack_50.x + 3.5;
      IStack_50.y = IStack_50.y + 3.5;
      local_58.x = fVar10;
      IStack_50.x = fVar11;
      if (((fVar10 < (pIVar4->ClipRect).Min.x) || (local_58.y < (pIVar4->ClipRect).Min.y)) ||
         ((pIVar4->ClipRect).Max.x < fVar11)) {
        bVar1 = false;
      }
      else {
        bVar1 = IStack_50.y <= (pIVar4->ClipRect).Max.y;
      }
      if (!bVar1) {
        cr_min.y = local_58.y + -1.0;
        cr_min.x = fVar10 + -1.0;
        cr_max.y = IStack_50.y + 1.0;
        cr_max.x = fVar11 + 1.0;
        ImDrawList::PushClipRect(pIVar4->DrawList,cr_min,cr_max,false);
      }
      this = pIVar4->DrawList;
      local_48.x = (GImGui->Style).Colors[0x30].x;
      local_48.y = (GImGui->Style).Colors[0x30].y;
      uVar5 = (GImGui->Style).Colors[0x30].z;
      uVar6 = (GImGui->Style).Colors[0x30].w;
      local_48.w = (GImGui->Style).Alpha * (float)uVar6;
      local_48.z = (float)uVar5;
      col = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(this,&local_58,&IStack_50,col,0.0,-1,2.0);
      if (!bVar1) {
        ImDrawList::PopClipRect(pIVar4->DrawList);
      }
    }
    pIVar7->DragDropAcceptFrameCount = pIVar7->FrameCount;
    pIVar8 = GImGui;
    if (IVar3 == IVar2) {
      iVar9 = pIVar7->DragDropMouseButton;
      if (4 < (ulong)(long)iVar9) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                    ,0x1159,"IsMouseDown","ImGui ASSERT FAILED: %s",
                    "button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown)");
      }
      bVar1 = (pIVar8->IO).MouseDown[iVar9];
      (pIVar7->DragDropPayload).Delivery = (bool)(bVar1 ^ 1);
      if ((((uint)flags >> 10 & 1) != 0) || (bVar1 == false)) {
LAB_002141d3:
        return &pIVar7->DragDropPayload;
      }
    }
    else {
      (pIVar7->DragDropPayload).Delivery = false;
      if (((uint)flags >> 10 & 1) != 0) goto LAB_002141d3;
    }
  }
  return (ImGuiPayload *)0x0;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface < g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
    {
        // FIXME-DRAG: Settle on a proper default visuals for drop target.
        r.Expand(3.5f);
        bool push_clip_rect = !window->ClipRect.Contains(r);
        if (push_clip_rect) window->DrawList->PushClipRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1));
        window->DrawList->AddRect(r.Min, r.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, ~0, 2.0f);
        if (push_clip_rect) window->DrawList->PopClipRect();
    }

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}